

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O2

cio_error cio_socket_init(cio_socket *socket,cio_address_family address_family,cio_eventloop *loop,
                         uint64_t close_timeout_ns,cio_socket_close_hook_t close_hook)

{
  int client_fd;
  cio_error cVar1;
  cio_error cVar2;
  int *piVar3;
  
  if (loop == (cio_eventloop *)0x0 || socket == (cio_socket *)0x0) {
    cVar2 = CIO_INVALID_ARGUMENT;
  }
  else {
    client_fd = cio_linux_socket_create(address_family);
    if (client_fd == -1) {
      piVar3 = __errno_location();
      cVar2 = -*piVar3;
    }
    else {
      cVar1 = cio_linux_socket_init(socket,client_fd,loop,close_timeout_ns,close_hook);
      cVar2 = CIO_SUCCESS;
      if (cVar1 != CIO_SUCCESS) {
        close(client_fd);
        cVar2 = cVar1;
      }
    }
  }
  return cVar2;
}

Assistant:

enum cio_error cio_socket_init(struct cio_socket *socket,
                               enum cio_address_family address_family,
                               struct cio_eventloop *loop,
                               uint64_t close_timeout_ns,
                               cio_socket_close_hook_t close_hook)
{
	if (cio_unlikely(socket == NULL) || (loop == NULL)) {
		return CIO_INVALID_ARGUMENT;
	}

	int socket_fd = cio_linux_socket_create(address_family);
	if (cio_unlikely(socket_fd == -1)) {
		return (enum cio_error)(-errno);
	}

	enum cio_error err = cio_linux_socket_init(socket, socket_fd, loop, close_timeout_ns, close_hook);
	if (cio_unlikely(err != CIO_SUCCESS)) {
		close(socket_fd);
	}

	return err;
}